

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# networkincludes.cpp
# Opt level: O0

int __thiscall MlmWrap::provideEvent(MlmWrap *this,char *event)

{
  ostream *this_00;
  string *in_RSI;
  MlmWrap *in_RDI;
  lock_guard<std::mutex> lock;
  zmsg_t *msg;
  int rc;
  mutex_type *in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff64;
  allocator local_79;
  string local_78 [32];
  string local_58 [56];
  zmsg_t *local_20;
  int local_14;
  MlmWrap *this_01;
  
  local_14 = 0xffffffff;
  this_01 = in_RDI;
  local_20 = czhelp_zmsg_create("ss","EVP",in_RSI);
  std::lock_guard<std::mutex>::lock_guard
            ((lock_guard<std::mutex> *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60)
             ,in_stack_ffffffffffffff58);
  local_14 = zactor_send(in_RDI->actor,&local_20);
  if (local_14 != 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_78,"Could not send \'provide event\' to actor",&local_79);
    error(this_01,in_RSI);
    this_00 = std::operator<<((ostream *)&std::cerr,local_58);
    std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string(local_58);
    std::__cxx11::string::~string(local_78);
    std::allocator<char>::~allocator((allocator<char> *)&local_79);
  }
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x36d940);
  return local_14;
}

Assistant:

int MlmWrap::provideEvent(const char *event){
    int rc = -1;
    zmsg_t *msg = czhelp_zmsg_create("ss", eventprovide, event);
    std::lock_guard<std::mutex> lock(actormutex);
    rc = zactor_send(actor, &msg);
    if(rc){
        std::cerr << error("Could not send 'provide event' to actor") << std::endl;;
    }
    return rc;
}